

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

Ch __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
::TakePush(NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_true,_false>
           *this)

{
  MemoryStream *pMVar1;
  Ch *pCVar2;
  Ch *pCVar3;
  Ch c;
  Ch CVar4;
  
  pMVar1 = ((this->
            super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
            ).is)->is_;
  pCVar2 = pMVar1->src_;
  if (pCVar2 == pMVar1->end_) {
    c = '\0';
  }
  else {
    c = *pCVar2;
  }
  StackStream<char>::Put(&this->stackStream,c);
  pMVar1 = ((this->
            super_NumberStream<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>,_false,_false>
            ).is)->is_;
  pCVar3 = pMVar1->src_;
  if (pCVar3 == pMVar1->end_) {
    CVar4 = '\0';
  }
  else {
    pMVar1->src_ = pCVar3 + 1;
    CVar4 = *pCVar3;
  }
  return CVar4;
}

Assistant:

RAPIDJSON_FORCEINLINE Ch TakePush() {
            stackStream.Put(static_cast<char>(Base::is.Peek()));
            return Base::is.Take();
        }